

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ArrayColumnData::GetColumnSegmentInfo
          (ArrayColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  iterator __position;
  reference pvVar1;
  pointer pCVar2;
  unsigned_long local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_68 = 0;
  __position._M_current =
       (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,__position,
               &local_68);
  }
  else {
    *__position._M_current = 0;
    (col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,&col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&(this->validity).super_ColumnData,row_group_index,
             (vector<unsigned_long,_true> *)&local_48,result);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar1 = vector<unsigned_long,_true>::back(col_path);
  *pvVar1 = 1;
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,&col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  (*pCVar2->_vptr_ColumnData[0x21])(pCVar2,row_group_index,&local_60,result);
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ArrayColumnData::GetColumnSegmentInfo(idx_t row_group_index, vector<idx_t> col_path,
                                           vector<ColumnSegmentInfo> &result) {
	col_path.push_back(0);
	validity.GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.back() = 1;
	child_column->GetColumnSegmentInfo(row_group_index, col_path, result);
}